

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapTypes.cpp
# Opt level: O3

void TTD::NSSnapType::AssertSnapEquiv(SnapType *t1,SnapType *t2,TTDCompareMap *compareMap)

{
  SnapHandler *h1;
  SnapHandler *h2;
  
  TTDCompareMap::DiagnosticAssert(compareMap,t1->JsTypeId == t2->JsTypeId);
  TTDCompareMap::DiagnosticAssert(compareMap,t1->ScriptContextLogId == t2->ScriptContextLogId);
  NSSnapValues::AssertSnapEquivTTDVar_Special
            (t1->PrototypeVar,t2->PrototypeVar,compareMap,L"prototype");
  h1 = t1->TypeHandlerInfo;
  h2 = t2->TypeHandlerInfo;
  if (h2 == (SnapHandler *)0x0 || h1 == (SnapHandler *)0x0) {
    TTDCompareMap::DiagnosticAssert(compareMap,h1 == (SnapHandler *)0x0 && h2 == (SnapHandler *)0x0)
    ;
    return;
  }
  AssertSnapEquiv(h1,h2,compareMap);
  return;
}

Assistant:

void AssertSnapEquiv(const SnapType* t1, const SnapType* t2, TTDCompareMap& compareMap)
        {
            compareMap.DiagnosticAssert(t1->JsTypeId == t2->JsTypeId);
            compareMap.DiagnosticAssert(t1->ScriptContextLogId == t2->ScriptContextLogId);

            NSSnapValues::AssertSnapEquivTTDVar_Special(t1->PrototypeVar, t2->PrototypeVar, compareMap, _u("prototype"));

            if(t1->TypeHandlerInfo == nullptr || t2->TypeHandlerInfo == nullptr)
            {
                compareMap.DiagnosticAssert(t1->TypeHandlerInfo == nullptr && t2->TypeHandlerInfo == nullptr);
            }
            else
            {
                AssertSnapEquiv(t1->TypeHandlerInfo, t2->TypeHandlerInfo, compareMap);
            }

            //
            //Disable until we have fix for set internal property changes state bug.
            //
            //compareMap.DiagnosticAssert(t1->HasNoEnumerableProperties == t2->HasNoEnumerableProperties);
        }